

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

size_t hpa_alloc_batch(tsdn_t *tsdn,pai_t *self,size_t size,size_t nallocs,
                      edata_list_active_t *results,_Bool frequent_reuse,
                      _Bool *deferred_work_generated)

{
  uint64_t uVar1;
  size_t sVar2;
  size_t sVar3;
  hpdata_t *hpdata;
  hpa_central_t *phVar4;
  hpa_central_t *central;
  tsdn_t *ptVar5;
  _Bool local_59;
  hpa_central_t *local_58;
  _Bool local_49;
  tsdn_t *local_48;
  hpdata_t *local_40;
  edata_list_active_t *local_38;
  
  if ((0x200000 < size || !frequent_reuse) && (self[100].shrink < size)) {
    return 0;
  }
  local_59 = false;
  local_48 = tsdn;
  sVar2 = hpa_try_alloc_batch_no_grow
                    (tsdn,(hpa_shard_t *)self,size,&local_59,nallocs,results,deferred_work_generated
                    );
  ptVar5 = local_48;
  if (nallocs - sVar2 == 0) {
    return nallocs;
  }
  if (local_59 != false) {
    return sVar2;
  }
  local_38 = results;
  malloc_mutex_lock(local_48,(malloc_mutex_t *)&self[3].alloc_batch);
  sVar3 = hpa_try_alloc_batch_no_grow
                    (ptVar5,(hpa_shard_t *)self,size,&local_59,nallocs - sVar2,local_38,
                     deferred_work_generated);
  ptVar5 = local_48;
  sVar3 = sVar3 + sVar2;
  if ((nallocs - sVar3 == 0) || (local_59 == true)) goto LAB_00e6bb94;
  central = (hpa_central_t *)self[1].alloc;
  malloc_mutex_lock(local_48,(malloc_mutex_t *)central);
  local_59 = false;
  if (central->eden == (void *)0x0) {
    local_49 = true;
    phVar4 = (hpa_central_t *)duckdb_je_pages_map((void *)0x0,0x10000000,0x200000,&local_49);
    if (phVar4 != (hpa_central_t *)0x0) {
      local_58 = phVar4;
      hpdata = hpa_alloc_ps(ptVar5,central);
      if (hpdata != (hpdata_t *)0x0) {
        central->eden = local_58;
        central->eden_len = 0x10000000;
        phVar4 = local_58;
        goto LAB_00e6bac6;
      }
      duckdb_je_pages_unmap(local_58,0x10000000);
    }
    (central->grow_mtx).field_0.field_0.locked.repr = false;
LAB_00e6bb8f:
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(central->grow_mtx).field_0 + 0x48));
  }
  else {
    sVar2 = central->eden_len;
    local_58 = central;
    hpdata = hpa_alloc_ps(ptVar5,central);
    phVar4 = local_58;
    if (sVar2 == 0x200000) {
      if (hpdata == (hpdata_t *)0x0) {
LAB_00e6bb64:
        (local_58->grow_mtx).field_0.field_0.locked.repr = false;
        central = local_58;
        goto LAB_00e6bb8f;
      }
      uVar1 = local_58->age_counter;
      local_58->age_counter = uVar1 + 1;
      local_40 = hpdata;
      duckdb_je_hpdata_init(hpdata,local_58->eden,uVar1);
      central->eden = (void *)0x0;
      central->eden_len = 0;
      (phVar4->grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(phVar4->grow_mtx).field_0 + 0x48));
      ptVar5 = local_48;
    }
    else {
      if (hpdata == (hpdata_t *)0x0) goto LAB_00e6bb64;
      phVar4 = (hpa_central_t *)central->eden;
      central = local_58;
      ptVar5 = local_48;
LAB_00e6bac6:
      uVar1 = central->age_counter;
      central->age_counter = uVar1 + 1;
      local_40 = hpdata;
      duckdb_je_hpdata_init(hpdata,phVar4,uVar1);
      central->eden = (void *)((long)central->eden + 0x200000);
      central->eden_len = central->eden_len - 0x200000;
      (central->grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(central->grow_mtx).field_0 + 0x48));
    }
    malloc_mutex_lock(ptVar5,(malloc_mutex_t *)&self[1].alloc_batch);
    duckdb_je_psset_insert((psset_t *)&self[5].dalloc_batch,local_40);
    *(undefined1 *)&self[2].expand = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
    sVar2 = hpa_try_alloc_batch_no_grow
                      (ptVar5,(hpa_shard_t *)self,size,&local_59,nallocs - sVar3,local_38,
                       deferred_work_generated);
    sVar3 = sVar3 + sVar2;
  }
LAB_00e6bb94:
  *(undefined1 *)&self[4].expand = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&self[4].shrink);
  return sVar3;
}

Assistant:

static size_t
hpa_alloc_batch(tsdn_t *tsdn, pai_t *self, size_t size, size_t nallocs,
    edata_list_active_t *results, bool frequent_reuse,
    bool *deferred_work_generated) {
	assert(nallocs > 0);
	assert((size & PAGE_MASK) == 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);
	hpa_shard_t *shard = hpa_from_pai(self);

	/*
	 * frequent_use here indicates this request comes from the arena bins,
	 * in which case it will be split into slabs, and therefore there is no
	 * intrinsic slack in the allocation (the entire range of allocated size
	 * will be accessed).
	 *
	 * In this case bypass the slab_max_alloc limit (if still within the
	 * huge page size).  These requests do not concern internal
	 * fragmentation with huge pages (again, the full size will be used).
	 */
	if (!(frequent_reuse && size <= HUGEPAGE) &&
	    (size > shard->opts.slab_max_alloc)) {
		return 0;
	}

	size_t nsuccess = hpa_alloc_batch_psset(tsdn, shard, size, nallocs,
	    results, deferred_work_generated);

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/*
	 * Guard the sanity checks with config_debug because the loop cannot be
	 * proven non-circular by the compiler, even if everything within the
	 * loop is optimized away.
	 */
	if (config_debug) {
		edata_t *edata;
		ql_foreach(edata, &results->head, ql_link_active) {
			emap_assert_mapped(tsdn, shard->emap, edata);
			assert(edata_pai_get(edata) == EXTENT_PAI_HPA);
			assert(edata_state_get(edata) == extent_state_active);
			assert(edata_arena_ind_get(edata) == shard->ind);
			assert(edata_szind_get_maybe_invalid(edata) ==
			    SC_NSIZES);
			assert(!edata_slab_get(edata));
			assert(edata_committed_get(edata));
			assert(edata_base_get(edata) == edata_addr_get(edata));
			assert(edata_base_get(edata) != NULL);
		}
	}
	return nsuccess;
}